

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O0

Mini_Lut_t * Gia_ManToMiniLut(Gia_Man_t *pGia)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Mini_Lut_t *p_02;
  Gia_Obj_t *pGVar4;
  Vec_Bit_t *p_03;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  uint local_ac;
  int local_a8;
  int Fanin;
  int LutInv;
  int Extra;
  word *pTruth;
  int pVars [16];
  int Count;
  int nWords;
  int LutSize;
  int iFanin;
  int k;
  int i;
  Vec_Int_t *vInvMap;
  Vec_Int_t *vLeaves;
  Gia_Obj_t *pFanin;
  Gia_Obj_t *pObj;
  Vec_Bit_t *vMarks;
  Mini_Lut_t *p;
  Gia_Man_t *pGia_local;
  
  p_00 = Vec_IntAlloc(0x10);
  iVar1 = Gia_ManObjNum(pGia);
  p_01 = Vec_IntStart(iVar1);
  pVars[0xe] = 0;
  iVar1 = Gia_ManHasMapping(pGia);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManHasMapping(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                  ,0x137,"Mini_Lut_t *Gia_ManToMiniLut(Gia_Man_t *)");
  }
  iVar1 = Gia_ManLutSizeMax(pGia);
  iVar1 = Abc_MaxInt(iVar1,2);
  pVars[0xf] = Abc_Truth6WordNum(iVar1);
  if (1 < iVar1) {
    p_02 = Mini_LutStart(iVar1);
    Gia_ManFillValue(pGia);
    pGVar4 = Gia_ManConst0(pGia);
    pGVar4->Value = 0;
    iFanin = 0;
    while( true ) {
      iVar2 = Vec_IntSize(pGia->vCis);
      bVar7 = false;
      if (iFanin < iVar2) {
        pFanin = Gia_ManCi(pGia,iFanin);
        bVar7 = pFanin != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      uVar3 = Mini_LutCreatePi(p_02);
      pFanin->Value = uVar3;
      iFanin = iFanin + 1;
    }
    p_03 = Gia_ManFindComplLuts(pGia);
    Gia_ObjComputeTruthTableStart(pGia,iVar1);
    iFanin = 1;
    do {
      iVar1 = Gia_ManObjNum(pGia);
      if (iVar1 <= iFanin) {
        Vec_IntFree(p_00);
        Vec_WrdClear(pGia->vTtMemory);
        for (iFanin = 0; iFanin < pVars[0xf]; iFanin = iFanin + 1) {
          Vec_WrdPush(pGia->vTtMemory,0x5555555555555555);
        }
        _LutInv = Vec_WrdArray(pGia->vTtMemory);
        iFanin = 0;
        while( true ) {
          iVar1 = Vec_IntSize(pGia->vCos);
          bVar7 = false;
          if (iFanin < iVar1) {
            pFanin = Gia_ManCo(pGia,iFanin);
            bVar7 = pFanin != (Gia_Obj_t *)0x0;
          }
          if (!bVar7) break;
          pGVar4 = Gia_ObjFanin0(pFanin);
          pGVar6 = Gia_ManConst0(pGia);
          if (pGVar4 == pGVar6) {
            iVar1 = Gia_ObjFaninC0(pFanin);
            uVar3 = Mini_LutCreatePo(p_02,iVar1);
            pFanin->Value = uVar3;
          }
          else {
            iVar1 = Gia_ObjFaninC0(pFanin);
            iVar2 = Gia_ObjFaninId0p(pGia,pFanin);
            iVar2 = Vec_BitEntry(p_03,iVar2);
            if (iVar1 == iVar2) {
              pGVar4 = Gia_ObjFanin0(pFanin);
              uVar3 = Mini_LutCreatePo(p_02,pGVar4->Value);
              pFanin->Value = uVar3;
            }
            else {
              pGVar4 = Gia_ObjFanin0(pFanin);
              local_ac = pGVar4->Value;
              local_a8 = Vec_IntEntry(p_01,local_ac);
              if (local_a8 == 0) {
                local_a8 = Mini_LutCreateNode(p_02,1,(int *)&local_ac,(uint *)_LutInv);
                Vec_IntWriteEntry(p_01,local_ac,local_a8);
                pVars[0xe] = pVars[0xe] + 1;
              }
              uVar3 = Mini_LutCreatePo(p_02,local_a8);
              pFanin->Value = uVar3;
            }
          }
          iFanin = iFanin + 1;
        }
        Vec_IntFree(p_01);
        Vec_BitFree(p_03);
        Gia_ObjComputeTruthTableStop(pGia);
        iVar1 = Gia_ManRegNum(pGia);
        Mini_LutSetRegNum(p_02,iVar1);
        return p_02;
      }
      iVar1 = Gia_ObjIsLut(pGia,iFanin);
      if (iVar1 != 0) {
        Vec_IntClear(p_00);
        for (LutSize = 0; iVar1 = Gia_ObjLutSize(pGia,iFanin), LutSize < iVar1;
            LutSize = LutSize + 1) {
          piVar5 = Gia_ObjLutFanins(pGia,iFanin);
          Vec_IntPush(p_00,piVar5[LutSize]);
        }
        iVar1 = Vec_IntSize(p_00);
        if (6 < iVar1) {
          iVar1 = Vec_IntSize(p_00);
          Fanin = iVar1 + -7;
          for (LutSize = Fanin; -1 < LutSize; LutSize = LutSize + -1) {
            iVar1 = Vec_IntEntry(p_00,LutSize);
            Vec_IntPush(p_00,iVar1);
          }
          for (LutSize = Fanin; -1 < LutSize; LutSize = LutSize + -1) {
            Vec_IntDrop(p_00,LutSize);
          }
          iVar1 = Vec_IntSize(p_00);
          iVar2 = Gia_ObjLutSize(pGia,iFanin);
          if (iVar1 != iVar2) {
            __assert_fail("Vec_IntSize(vLeaves) == Gia_ObjLutSize(pGia, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                          ,0x152,"Mini_Lut_t *Gia_ManToMiniLut(Gia_Man_t *)");
          }
        }
        LutSize = 0;
        while( true ) {
          iVar1 = Vec_IntSize(p_00);
          bVar7 = false;
          if (LutSize < iVar1) {
            iVar1 = Vec_IntEntry(p_00,LutSize);
            vLeaves = (Vec_Int_t *)Gia_ManObj(pGia,iVar1);
            bVar7 = vLeaves != (Vec_Int_t *)0x0;
          }
          if (!bVar7) break;
          pVars[(long)LutSize + -2] = *(int *)&vLeaves->pArray;
          LutSize = LutSize + 1;
        }
        pFanin = Gia_ManObj(pGia,iFanin);
        _LutInv = Gia_ObjComputeTruthTableCut(pGia,pFanin,p_00);
        iVar1 = Vec_BitEntry(p_03,iFanin);
        if (iVar1 != 0) {
          Abc_TtNot(_LutInv,pVars[0xf]);
        }
        for (LutSize = 0; iVar1 = Vec_IntSize(p_00), LutSize < iVar1; LutSize = LutSize + 1) {
          iVar1 = Vec_IntEntry(p_00,LutSize);
          iVar1 = Vec_BitEntry(p_03,iVar1);
          if (iVar1 != 0) {
            Abc_TtFlip(_LutInv,pVars[0xf],LutSize);
          }
        }
        iVar1 = Gia_ObjLutSize(pGia,iFanin);
        uVar3 = Mini_LutCreateNode(p_02,iVar1,(int *)&pTruth,(uint *)_LutInv);
        pFanin->Value = uVar3;
      }
      iFanin = iFanin + 1;
    } while( true );
  }
  __assert_fail("LutSize >= 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                ,0x13b,"Mini_Lut_t *Gia_ManToMiniLut(Gia_Man_t *)");
}

Assistant:

Mini_Lut_t * Gia_ManToMiniLut( Gia_Man_t * pGia )
{
    Mini_Lut_t * p;
    Vec_Bit_t * vMarks;
    Gia_Obj_t * pObj, * pFanin;
    Vec_Int_t * vLeaves = Vec_IntAlloc( 16 );
    Vec_Int_t * vInvMap = Vec_IntStart( Gia_ManObjNum(pGia) );
    int i, k, iFanin, LutSize, nWords, Count = 0, pVars[16];
    word * pTruth;
    assert( Gia_ManHasMapping(pGia) );
    LutSize = Gia_ManLutSizeMax( pGia );
    LutSize = Abc_MaxInt( LutSize, 2 );
    nWords  = Abc_Truth6WordNum( LutSize );
    assert( LutSize >= 2 );
    // create the manager
    p = Mini_LutStart( LutSize );
    // create primary inputs
    Gia_ManFillValue( pGia );
    Gia_ManConst0(pGia)->Value = 0;
    Gia_ManForEachCi( pGia, pObj, i )
        pObj->Value = Mini_LutCreatePi(p);
    // create internal nodes
    vMarks = Gia_ManFindComplLuts( pGia );
    Gia_ObjComputeTruthTableStart( pGia, LutSize );
    Gia_ManForEachLut( pGia, i )
    {
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( pGia, i, iFanin, k )
            Vec_IntPush( vLeaves, iFanin );
        if ( Vec_IntSize(vLeaves) > 6 )
        {
            int Extra = Vec_IntSize(vLeaves) - 7;
            for ( k = Extra; k >= 0; k-- )
                Vec_IntPush( vLeaves, Vec_IntEntry(vLeaves, k) );
            for ( k = Extra; k >= 0; k-- )
                Vec_IntDrop( vLeaves, k );
            assert( Vec_IntSize(vLeaves) == Gia_ObjLutSize(pGia, i) );
        }
        Gia_ManForEachObjVec( vLeaves, pGia, pFanin, k )
            pVars[k] = pFanin->Value;
        pObj = Gia_ManObj( pGia, i );
        pTruth = Gia_ObjComputeTruthTableCut( pGia, pObj, vLeaves );
        if ( Vec_BitEntry(vMarks, i) )
            Abc_TtNot( pTruth, nWords );
        Vec_IntForEachEntry( vLeaves, iFanin, k )
            if ( Vec_BitEntry(vMarks, iFanin) )
                Abc_TtFlip( pTruth, nWords, k );
        pObj->Value = Mini_LutCreateNode( p, Gia_ObjLutSize(pGia, i), pVars, (unsigned *)pTruth );
    }
    Vec_IntFree( vLeaves );
    // create inverter truth table
    Vec_WrdClear( pGia->vTtMemory );
    for ( i = 0; i < nWords; i++ )
        Vec_WrdPush( pGia->vTtMemory, ABC_CONST(0x5555555555555555) );
    pTruth = Vec_WrdArray( pGia->vTtMemory );
    // create primary outputs
    Gia_ManForEachCo( pGia, pObj, i )
    {
        if ( Gia_ObjFanin0(pObj) == Gia_ManConst0(pGia) )
            pObj->Value = Mini_LutCreatePo( p, Gia_ObjFaninC0(pObj) );
        else if ( Gia_ObjFaninC0(pObj) == Vec_BitEntry(vMarks, Gia_ObjFaninId0p(pGia, pObj)) )
            pObj->Value = Mini_LutCreatePo( p, Gia_ObjFanin0(pObj)->Value );
        else // add inverter LUT
        {
            int LutInv, Fanin = Gia_ObjFanin0(pObj)->Value;
            if ( (LutInv = Vec_IntEntry(vInvMap, Fanin)) == 0 )
            {
                LutInv = Mini_LutCreateNode( p, 1, &Fanin, (unsigned *)pTruth );
                Vec_IntWriteEntry( vInvMap, Fanin, LutInv );
                Count++;
            }
            pObj->Value = Mini_LutCreatePo( p, LutInv );
        }
    }
    Vec_IntFree( vInvMap );
    Vec_BitFree( vMarks );
    Gia_ObjComputeTruthTableStop( pGia );
    // set registers
    Mini_LutSetRegNum( p, Gia_ManRegNum(pGia) );
    //Mini_LutPrintStats( p );
    //printf( "Added %d inverters.\n", Count );
    return p;
}